

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_money.cpp
# Opt level: O3

int money_eq(money_t *money1,money_t *money2)

{
  uint uVar1;
  int iVar2;
  
  if (money1 == money2) {
    uVar1 = 1;
  }
  else {
    uVar1 = 0;
    if ((money1 != (money_t *)0x0 || money2 == (money_t *)0x0) &&
       (money1 == (money_t *)0x0 || money2 != (money_t *)0x0)) {
      if (money1 == (money_t *)0x0) {
        __assert_fail("money1 != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/build_O3/tests/test_money.cpp"
                      ,0x96,"int money_eq(const money_t *, const money_t *)");
      }
      if (money2 == (money_t *)0x0) {
        __assert_fail("money2 != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/build_O3/tests/test_money.cpp"
                      ,0x97,"int money_eq(const money_t *, const money_t *)");
      }
      if (money1->amount == money2->amount) {
        iVar2 = strcmp(money1->currency,money2->currency);
        uVar1 = (uint)(iVar2 == 0);
      }
    }
  }
  return uVar1;
}

Assistant:

static int
money_eq(money_t const *money1, money_t const *money2)
{
    int is_same_curr =0;
    int is_same_amt =0;


    /* Are they pointing to the same memory, then they are the same object.
    This also catches the case when they are both NULL. */
    if ( money1 == money2 )
    {
        return 1;
    }

    /* If money1 XOR money2 are NULL, then we kick out. */
    if (
        (money1 == NULL && money2 != NULL) \
        || (money1 != NULL && money2 == NULL)
    )
    {
        return 0;
    }

    /* At this point we shouldn't have any NULL money objects. */
    assert( money1 != NULL );
    assert( money2 != NULL );

    is_same_amt = money__amount(money1) == money__amount(money2);
    if ( !is_same_amt )
    {
        return 0;
    }

    is_same_curr = money_curr_eq(money1, money2);

    /* If they are the same currency, and the passed the eariler tests, then
    they are the same object. */
    return is_same_curr;
}